

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocket.cpp
# Opt level: O0

void __thiscall
asl::WebSocketServer::process(WebSocketServer *this,Socket *client,Dic<asl::String> *headers)

{
  Map<asl::String,_asl::String> *pMVar1;
  Dic<asl::String> *this_00;
  bool bVar2;
  int iVar3;
  String *pSVar4;
  uchar *data;
  char *pcVar5;
  WebSocket **x;
  byte local_1f1;
  WebSocket *local_1d0;
  Lock local_1c8;
  Lock l_1;
  Lock local_1b8;
  Lock l;
  WebSocket ws;
  String local_160;
  undefined1 local_148 [8];
  String digest;
  undefined1 local_114 [8];
  Hash hash;
  undefined1 local_e8 [8];
  String key;
  String local_c8;
  byte local_aa;
  byte local_a9;
  String local_a8;
  byte local_89;
  String local_88;
  undefined1 local_70 [56];
  String local_38;
  Map<asl::String,_asl::String> *local_20;
  Dic<asl::String> *headers_local;
  Socket *client_local;
  WebSocketServer *this_local;
  
  local_20 = &headers->super_Map<asl::String,_asl::String>;
  headers_local = (Dic<asl::String> *)client;
  client_local = (Socket *)this;
  asl::String::String(&local_38,"Upgrade");
  local_70[0xf] = 0;
  local_89 = 0;
  local_a9 = 0;
  local_aa = 0;
  key.field_2._space[0xf] = '\0';
  bVar2 = Map<asl::String,_asl::String>::has
                    (&headers->super_Map<asl::String,_asl::String>,&local_38);
  pMVar1 = local_20;
  local_1f1 = 1;
  if (bVar2) {
    asl::String::String((String *)(local_70 + 0x10),"Upgrade");
    local_70[0xf] = 1;
    pSVar4 = Map<asl::String,_asl::String>::operator[](pMVar1,(String *)(local_70 + 0x10));
    bVar2 = asl::String::operator!=(pSVar4,"websocket");
    pMVar1 = local_20;
    local_1f1 = 1;
    if (!bVar2) {
      asl::String::String(&local_88,"Connection");
      local_89 = 1;
      pSVar4 = Map<asl::String,_asl::String>::operator[](pMVar1,&local_88);
      asl::String::String(&local_a8,", ");
      local_a9 = 1;
      asl::String::split((String *)local_70,pSVar4);
      local_aa = 1;
      asl::String::String(&local_c8,"Upgrade");
      key.field_2._space[0xf] = '\x01';
      bVar2 = Array<asl::String>::contains((Array<asl::String> *)local_70,&local_c8);
      local_1f1 = bVar2 ^ 0xff;
    }
  }
  if ((key.field_2._space[0xf] & 1U) != 0) {
    asl::String::~String(&local_c8);
  }
  if ((local_aa & 1) != 0) {
    Array<asl::String>::~Array((Array<asl::String> *)local_70);
  }
  if ((local_a9 & 1) != 0) {
    asl::String::~String(&local_a8);
  }
  if ((local_89 & 1) != 0) {
    asl::String::~String(&local_88);
  }
  if ((local_70[0xf] & 1) != 0) {
    asl::String::~String((String *)(local_70 + 0x10));
  }
  asl::String::~String(&local_38);
  pMVar1 = local_20;
  if ((local_1f1 & 1) == 0) {
    asl::String::String((String *)(hash._a + 0xc),"Sec-Websocket-Key");
    pSVar4 = Map<asl::String,_asl::String>::operator[](pMVar1,(String *)(hash._a + 0xc));
    asl::String::String((String *)local_e8,pSVar4);
    asl::String::~String((String *)(hash._a + 0xc));
    asl::String::operator+
              ((String *)((long)&digest.field_2 + 8),(String *)local_e8,
               "258EAFA5-E914-47DA-95CA-C5AB0DC85B11");
    SHA1::hash((Hash *)local_114,(String *)((long)&digest.field_2 + 8));
    asl::String::~String((String *)((long)&digest.field_2 + 8));
    data = Array_::operator_cast_to_unsigned_char_((Array_ *)local_114);
    iVar3 = Array_<unsigned_char,_20>::length((Array_<unsigned_char,_20> *)local_114);
    encodeBase64((String *)local_148,data,iVar3);
    this_00 = headers_local;
    pcVar5 = asl::String::operator*((String *)local_148);
    asl::String::String(&local_160,0xb4,
                        "HTTP/1.1 101 Switching Protocols\r\nUpgrade: websocket\r\nConnection: Upgrade\r\nSec-WebSocket-Accept: %s\r\n"
                        ,pcVar5);
    Socket::operator<<((Socket *)this_00,&local_160);
    asl::String::~String(&local_160);
    pMVar1 = local_20;
    asl::String::String((String *)(ws._random._state + 3),"Sec-Websocket-Protocol");
    bVar2 = Map<asl::String,_asl::String>::has(pMVar1,(String *)(ws._random._state + 3));
    asl::String::~String((String *)(ws._random._state + 3));
    if (bVar2) {
      Socket::operator<<((Socket *)headers_local,"Sec-Websocket-Protocol: chat\r\n");
    }
    Socket::operator<<((Socket *)headers_local,"\r\n");
    WebSocket::WebSocket((WebSocket *)&l,(Socket *)headers_local,false);
    Lock::Lock(&local_1b8,&this->_mutex);
    l_1._m = (Mutex *)&l;
    Array<asl::WebSocket_*>::operator<<(&this->_clients,(WebSocket **)&l_1);
    Lock::~Lock(&local_1b8);
    (*(this->super_SocketServer)._vptr_SocketServer[1])(this,&l);
    Lock::Lock(&local_1c8,&this->_mutex);
    local_1d0 = (WebSocket *)&l;
    x = &local_1d0;
    Array<asl::WebSocket_*>::removeOne(&this->_clients,x,0);
    iVar3 = (int)x;
    Lock::~Lock(&local_1c8);
    Socket::close((Socket *)headers_local,iVar3);
    WebSocket::~WebSocket((WebSocket *)&l);
    asl::String::~String((String *)local_148);
    Array_<unsigned_char,_20>::~Array_((Array_<unsigned_char,_20> *)local_114);
    asl::String::~String((String *)local_e8);
  }
  else {
    Socket::operator<<((Socket *)headers_local,
                       "HTTP/1.1 400 Bad request\r\n\r\nNot a WebSocket request");
  }
  return;
}

Assistant:

void WebSocketServer::process(Socket& client, const Dic<String>& headers)
{
	if (!headers.has("Upgrade") || headers["Upgrade"] != "websocket" || !headers["Connection"].split(", ").contains("Upgrade"))
	{
		client << "HTTP/1.1 400 Bad request\r\n\r\nNot a WebSocket request";
		return;
	}

	String key = headers["Sec-Websocket-Key"];

	SHA1::Hash hash = SHA1::hash(key + "258EAFA5-E914-47DA-95CA-C5AB0DC85B11");
	String digest = encodeBase64(hash, hash.length());

	client << String(180, "HTTP/1.1 101 Switching Protocols\r\n"
		"Upgrade: websocket\r\n"
		"Connection: Upgrade\r\n"
		"Sec-WebSocket-Accept: %s\r\n", *digest);

	if (headers.has("Sec-Websocket-Protocol"))
		client << "Sec-Websocket-Protocol: chat\r\n";
	client << "\r\n";

	WebSocket ws(client, false);
	{
		Lock l(_mutex);
		_clients << &ws;
	}
	serve(ws);
	{
		Lock l(_mutex);
		_clients.removeOne(&ws);
	}
	client.close();
}